

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::VarintCases_ExpectTag_Test::TestBody
          (VarintCases_ExpectTag_Test *this)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  ParamType *__src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint8_t dummy;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  CodedInputStream coded_input;
  ArrayInputStream input;
  byte local_f9;
  AssertHelper local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  AssertHelper local_e8;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  AssertHelper local_98;
  AssertHelper local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_80;
  ArrayInputStream *local_78;
  undefined7 local_70;
  undefined1 uStack_69;
  undefined7 uStack_68;
  undefined8 local_60;
  int local_58;
  int local_54;
  int local_50;
  DescriptorPool *local_48;
  MessageFactory *pMStack_40;
  ArrayInputStream local_38;
  
  __src = testing::WithParamInterface<google::protobuf::io::(anonymous_namespace)::VarintCase>::
          GetParam();
  io::(anonymous_namespace)::CodedStreamTest::buffer_ = 0;
  memcpy(&DAT_019f3911,__src,__src->size);
  ArrayInputStream::ArrayInputStream
            (&local_38,&io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,-1);
  local_88 = (undefined1  [8])0x0;
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_70 = 0;
  uStack_69 = 0;
  uStack_68._0_4_ = 0;
  uStack_68._4_1_ = false;
  uStack_68._5_1_ = false;
  uStack_68._6_1_ = false;
  local_60._0_4_ = 0x7fffffff;
  local_60._4_4_ = 0;
  local_58 = 0x7fffffff;
  local_54 = CodedInputStream::default_recursion_limit_;
  local_50 = CodedInputStream::default_recursion_limit_;
  local_48 = (DescriptorPool *)0x0;
  pMStack_40 = (MessageFactory *)0x0;
  local_78 = &local_38;
  CodedInputStream::Refresh((CodedInputStream *)local_88);
  CodedInputStream::ReadRaw((CodedInputStream *)local_88,&local_f9,1);
  local_e0 = (undefined1  [8])((ulong)(uint)local_e0._4_4_ << 0x20);
  local_f8.data_._0_4_ = (uint)local_f9;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_b8,"(uint)\'\\0\'","(uint)dummy",(uint *)local_e0,(uint *)&local_f8);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e0);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0xcc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  uVar2 = (uint)__src->value;
  if (__src->size < 3) {
    uVar1 = uVar2 + 1;
    if (uVar1 < 0x80) {
      local_e0[0] = '\x01';
      if (((ulong)local_88 < pbStack_80) && (uVar1 == *(byte *)&((_Alloc_hider *)local_88)->_M_p)) {
        local_88 = (undefined1  [8])((long)&((_Alloc_hider *)local_88)->_M_p + 1);
LAB_00aec39d:
        local_e0[0] = '\0';
      }
    }
    else {
      local_e0[0] = '\x01';
      if (((uVar1 < 0x4000) && (1 < (int)pbStack_80 - local_88._0_4_)) &&
         (((uVar1 & 0xff | 0x80) == (uint)*(byte *)&((_Alloc_hider *)local_88)->_M_p &&
          (uVar1 >> 7 == (uint)*(byte *)((long)&((_Alloc_hider *)local_88)->_M_p + 1))))) {
        local_88 = (undefined1  [8])((long)&((_Alloc_hider *)local_88)->_M_p + 2);
        goto LAB_00aec39d;
      }
    }
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_e0[0] == '\0') {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_b8,(internal *)local_e0,
                 (AssertionResult *)"coded_input.ExpectTag(expected_value + 1)","true","false",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                 ,0xd2,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_e8);
      io::_GLOBAL__N_1::VarintCases_ExpectTag_Test::TestBody();
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
    if (uVar2 < 0x80) {
      if ((pbStack_80 <= (ulong)local_88) || (*(byte *)&((_Alloc_hider *)local_88)->_M_p != uVar2))
      goto LAB_00aec5e2;
      local_88 = (undefined1  [8])((long)&((_Alloc_hider *)local_88)->_M_p + 1);
LAB_00aec48c:
      cVar3 = '\x01';
    }
    else {
      if ((((uVar2 < 0x4000) && (1 < (int)pbStack_80 - local_88._0_4_)) &&
          ((uVar2 & 0xff | 0x80) == (uint)*(byte *)&((_Alloc_hider *)local_88)->_M_p)) &&
         (uVar2 >> 7 == (uint)*(byte *)((long)&((_Alloc_hider *)local_88)->_M_p + 1))) {
        local_88 = (undefined1  [8])((long)&((_Alloc_hider *)local_88)->_M_p + 2);
        goto LAB_00aec48c;
      }
LAB_00aec5e2:
      cVar3 = '\0';
    }
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_f0;
    local_f8.data_._0_1_ = cVar3;
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    __ptr_00 = local_f0;
    if (cVar3 == '\0') {
      testing::Message::Message((Message *)&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e0,(internal *)&local_f8,
                 (AssertionResult *)"coded_input.ExpectTag(expected_value)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                 ,0xd3,(char *)local_e0);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_e0 != (undefined1  [8])&local_d0) {
        operator_delete((void *)local_e0,local_d0._M_allocated_capacity + 1);
      }
      __ptr_00 = local_f0;
      if (local_c0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c0._M_head_impl + 8))();
        __ptr_00 = local_f0;
      }
    }
  }
  else {
    if (uVar2 < 0x80) {
      local_e0[0] = '\x01';
      if (((ulong)local_88 < pbStack_80) && (*(byte *)&((_Alloc_hider *)local_88)->_M_p == uVar2)) {
        local_88 = (undefined1  [8])((long)&((_Alloc_hider *)local_88)->_M_p + 1);
LAB_00aec3dd:
        local_e0[0] = '\0';
      }
    }
    else {
      local_e0[0] = '\x01';
      if ((((uVar2 < 0x4000) && (1 < (int)pbStack_80 - local_88._0_4_)) &&
          ((uVar2 & 0xff | 0x80) == (uint)*(byte *)&((_Alloc_hider *)local_88)->_M_p)) &&
         (uVar2 >> 7 == (uint)*(byte *)((long)&((_Alloc_hider *)local_88)->_M_p + 1))) {
        local_88 = (undefined1  [8])((long)&((_Alloc_hider *)local_88)->_M_p + 2);
        goto LAB_00aec3dd;
      }
    }
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_d8;
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    __ptr_00 = local_d8;
    if (local_e0[0] == '\0') {
      testing::Message::Message((Message *)&local_f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_b8,(internal *)local_e0,
                 (AssertionResult *)"coded_input.ExpectTag(expected_value)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                 ,0xd5,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
      testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity + 1);
      }
      __ptr_00 = local_d8;
      if (local_f8.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_f8.data_ + 8))();
        __ptr_00 = local_d8;
      }
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_00,__ptr_00);
  }
  CodedInputStream::~CodedInputStream((CodedInputStream *)local_88);
  if (__src->size < 3) {
    local_e0 = (undefined1  [8])(__src->size + 1);
    local_f8.data_ = (AssertHelperData *)ArrayInputStream::ByteCount(&local_38);
    testing::internal::CmpHelperEQ<unsigned_long,long>
              ((internal *)local_88,"kVarintCases_case.size + 1","input.ByteCount()",
               (unsigned_long *)local_e0,(long *)&local_f8);
    if (local_88[0] != (internal)0x0) goto LAB_00aec803;
    testing::Message::Message((Message *)local_e0);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0xda,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)local_e0);
  }
  else {
    local_f8.data_._0_4_ = 1;
    local_e0 = (undefined1  [8])ArrayInputStream::ByteCount(&local_38);
    testing::internal::CmpHelperEQ<int,long>
              ((internal *)local_88,"1","input.ByteCount()",(int *)&local_f8,(long *)local_e0);
    if (local_88[0] != (internal)0x0) goto LAB_00aec803;
    testing::Message::Message((Message *)local_e0);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0xdc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)local_e0);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_f8);
  if (local_e0 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_e0 + 8))();
  }
LAB_00aec803:
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  return;
}

Assistant:

TEST_P(VarintCases, ExpectTag) {
  const VarintCase& kVarintCases_case = GetParam();
  // Leave one byte at the beginning of the buffer so we can read it
  // to force the first buffer to be loaded.
  buffer_[0] = '\0';
  memcpy(buffer_ + 1, kVarintCases_case.bytes, kVarintCases_case.size);
  ArrayInputStream input(buffer_, sizeof(buffer_));

  {
    CodedInputStream coded_input(&input);

    // Read one byte to force coded_input.Refill() to be called.  Otherwise,
    // ExpectTag() will return a false negative.
    uint8_t dummy;
    coded_input.ReadRaw(&dummy, 1);
    EXPECT_EQ((uint)'\0', (uint)dummy);

    uint32_t expected_value = static_cast<uint32_t>(kVarintCases_case.value);

    // ExpectTag() produces false negatives for large values.
    if (kVarintCases_case.size <= 2) {
      EXPECT_FALSE(coded_input.ExpectTag(expected_value + 1));
      EXPECT_TRUE(coded_input.ExpectTag(expected_value));
    } else {
      EXPECT_FALSE(coded_input.ExpectTag(expected_value));
    }
  }

  if (kVarintCases_case.size <= 2) {
    EXPECT_EQ(kVarintCases_case.size + 1, input.ByteCount());
  } else {
    EXPECT_EQ(1, input.ByteCount());
  }
}